

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

void __thiscall BeliefSparse::Set(BeliefSparse *this,StateDistribution *belief)

{
  size_type sVar1;
  size_type sVar2;
  pointer puVar3;
  size_type __n;
  pointer pdVar4;
  size_type sVar5;
  int iVar6;
  undefined4 extraout_var;
  unsigned_long *puVar8;
  double *pdVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar10;
  double extraout_XMM0_Qa;
  double p;
  value_type local_48;
  sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  local_40;
  ulong uVar7;
  
  iVar6 = (*belief->_vptr_StateDistribution[4])(belief);
  uVar7 = CONCAT44(extraout_var,iVar6);
  (this->_m_b).size_ = uVar7;
  sVar1 = (this->_m_b).capacity_;
  sVar2 = (this->_m_b).index_data_.size_;
  uVar10 = sVar1 + (sVar1 == 0);
  if (uVar7 < uVar10) {
    uVar10 = uVar7;
  }
  (this->_m_b).capacity_ = uVar10;
  if (sVar2 != uVar10) {
    puVar3 = (this->_m_b).index_data_.data_;
    if (uVar7 != 0) {
      puVar8 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)&(this->_m_b).index_data_,uVar10,
                          (void *)0x0);
      (this->_m_b).index_data_.data_ = puVar8;
    }
    sVar1 = (this->_m_b).index_data_.size_;
    if (sVar1 != 0) {
      operator_delete(puVar3,sVar1 << 3);
    }
    if (uVar7 == 0) {
      (this->_m_b).index_data_.data_ = (pointer)0x0;
    }
    (this->_m_b).index_data_.size_ = uVar10;
  }
  __n = (this->_m_b).capacity_;
  if ((this->_m_b).value_data_.size_ != __n) {
    pdVar4 = (this->_m_b).value_data_.data_;
    if (__n != 0) {
      pdVar9 = __gnu_cxx::new_allocator<double>::allocate
                         ((new_allocator<double> *)&(this->_m_b).value_data_,__n,(void *)0x0);
      (this->_m_b).value_data_.data_ = pdVar9;
    }
    sVar5 = (this->_m_b).value_data_.size_;
    if (sVar5 != 0) {
      operator_delete(pdVar4,sVar5 << 3);
    }
    if (__n == 0) {
      (this->_m_b).value_data_.data_ = (pointer)0x0;
    }
    (this->_m_b).value_data_.size_ = __n;
  }
  (this->_m_b).filled_ = 0;
  iVar6 = (*belief->_vptr_StateDistribution[4])(belief);
  if (CONCAT44(extraout_var_00,iVar6) != 0) {
    uVar10 = 0;
    do {
      (*belief->_vptr_StateDistribution[2])(belief,uVar10);
      if (0.0 < extraout_XMM0_Qa) {
        local_40.
        super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        .c_ = &this->_m_b;
        local_40.i_ = uVar10;
        boost::numeric::ublas::
        sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        ::set(&local_40,&local_48);
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      iVar6 = (*belief->_vptr_StateDistribution[4])(belief);
    } while (CONCAT44(extraout_var_01,iVar6) != uVar10);
  }
  return;
}

Assistant:

void BeliefSparse::Set(const StateDistribution& belief)
{
    _m_b.resize(belief.GetNrStates(),false);
    _m_b.clear();
    
    for(unsigned int i=0;i!=belief.GetNrStates();++i)
    {
        double p=belief.GetProbability(i);
        if(p>0)
            _m_b[i]=p;
    }

}